

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O3

string * __thiscall
soul::HEARTGenerator::getOriginalModulePath_abi_cxx11_
          (string *__return_storage_ptr__,HEARTGenerator *this,IdentifierPath *path)

{
  Identifier *endElement;
  _func_int *p_Var1;
  _func_int **pp_Var2;
  int iVar3;
  Identifier *startElement;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_70;
  
  if ((this->sourceGraph).object == (Graph *)0x0) {
    throwInternalCompilerError("! empty()","front",0xa8);
  }
  p_Var1 = *(this->super_ASTVisitor)._vptr_ASTVisitor;
  if (p_Var1 != (_func_int *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)p_Var1);
    if (iVar3 == 0) {
      IdentifierPath::fromSecondPart((IdentifierPath *)&local_70,(IdentifierPath *)this);
      ArrayWithPreallocation<soul::Identifier,_8UL>::operator=
                ((ArrayWithPreallocation<soul::Identifier,_8UL> *)this,&local_70);
      local_70.numActive = 0;
      if ((8 < local_70.numAllocated) && (local_70.items != (Identifier *)0x0)) {
        operator_delete__(local_70.items);
      }
      pp_Var2 = (this->super_ASTVisitor)._vptr_ASTVisitor;
      endElement = (Identifier *)(pp_Var2 + (long)(this->sourceGraph).object);
      startElement = std::
                     __remove_if<soul::Identifier*,__gnu_cxx::__ops::_Iter_pred<soul::HEARTGenerator::getOriginalModulePath[abi:cxx11](soul::IdentifierPath)::_lambda(soul::Identifier_const&)_1_>>
                               (pp_Var2,endElement);
      if (startElement != endElement) {
        ArrayWithPreallocation<soul::Identifier,_8UL>::erase
                  ((ArrayWithPreallocation<soul::Identifier,_8UL> *)this,startElement,endElement);
      }
      IdentifierPath::toString_abi_cxx11_(__return_storage_ptr__,(IdentifierPath *)this);
      return __return_storage_ptr__;
    }
    throwInternalCompilerError
              ("path.getFirstPart().toString() == Program::getRootNamespaceName()",
               "getOriginalModulePath",0x62);
  }
  throwInternalCompilerError("isValid()","toString",0x23);
}

Assistant:

void visit (AST::Graph& g) override
    {
        module.annotation = g.annotation.toPlainAnnotation (module.program.getStringDictionary());
        sourceGraph = g;

        parsingStateVariables = true;
        super::visit (g);
        parsingStateVariables = false;
    }